

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TriggerVariable.hpp
# Opt level: O2

bool __thiscall
gmlc::concurrency::TriggerVariable::wait_forActivation(TriggerVariable *this,milliseconds *duration)

{
  bool bVar1;
  unique_lock<std::mutex> lk;
  unique_lock<std::mutex> uStack_28;
  
  std::unique_lock<std::mutex>::unique_lock(&uStack_28,&this->activeLock);
  bVar1 = true;
  if (((this->activated)._M_base._M_i & 1U) == 0) {
    bVar1 = std::condition_variable::
            wait_for<long,std::ratio<1l,1000l>,gmlc::concurrency::TriggerVariable::wait_forActivation(std::chrono::duration<long,std::ratio<1l,1000l>>const&)const::_lambda()_1_>
                      (&this->cv_active,&uStack_28,duration,(anon_class_8_1_8991fb9c)this);
  }
  std::unique_lock<std::mutex>::~unique_lock(&uStack_28);
  return bVar1;
}

Assistant:

bool wait_forActivation(const std::chrono::milliseconds& duration) const
    {
        std::unique_lock<std::mutex> lk(activeLock);
        if (!activated) {
            return cv_active.wait_for(lk, duration, [this] {
                return activated.load();
            });
        }
        return true;
    }